

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O1

_Bool hashmap_iter(hashmap *map,size_t *i,void **item)

{
  ulong uVar1;
  ulong uVar2;
  void *pvVar3;
  long lVar4;
  
  do {
    uVar1 = *i;
    uVar2 = map->nbuckets;
    if (uVar2 <= uVar1) goto LAB_0010c538;
    pvVar3 = map->buckets;
    lVar4 = map->bucketsz * uVar1;
    *i = uVar1 + 1;
  } while (*(short *)((long)pvVar3 + lVar4 + 6) == 0);
  *item = (void *)((long)pvVar3 + lVar4 + 8);
LAB_0010c538:
  return uVar1 < uVar2;
}

Assistant:

bool hashmap_iter(struct hashmap *map, size_t *i, void **item) {
    struct bucket *bucket;
    do {
        if (*i >= map->nbuckets) return false;
        bucket = bucket_at(map, *i);
        (*i)++;
    } while (!bucket->dib);
    *item = bucket_item(bucket);
    return true;
}